

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *this,
          TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *param_1)

{
  undefined3 uVar1;
  ElementType EVar2;
  TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *param_1_local;
  TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::GeomSubset::ElementType>::optional
            (&this->_attrib,&param_1->_attrib);
  uVar1 = *(undefined3 *)&param_1->field_0x229;
  EVar2 = param_1->_fallback;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x229 = uVar1;
  this->_fallback = EVar2;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }